

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O2

uint32_t lzma_mf_bt3_find(lzma_mf *mf,lzma_match *matches)

{
  uint8_t *cur;
  uint8_t *puVar1;
  uint32_t *puVar2;
  ulong uVar3;
  lzma_match *plVar4;
  uint uVar5;
  uint32_t pos;
  uint len_limit;
  char *__assertion;
  uint uVar6;
  uint uVar7;
  uint32_t len_best;
  ulong uVar8;
  uint uVar9;
  uint32_t uVar10;
  long lVar11;
  
  uVar9 = mf->read_pos;
  uVar5 = mf->write_pos - uVar9;
  len_limit = mf->nice_len;
  if (uVar5 < mf->nice_len) {
    if (uVar5 < 3) {
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x26e,"uint32_t lzma_mf_bt3_find(lzma_mf *, lzma_match *)");
      }
    }
    else {
      len_limit = uVar5;
      if (mf->action != LZMA_SYNC_FLUSH) goto LAB_005187d6;
    }
    move_pending(mf);
    uVar10 = 0;
  }
  else {
LAB_005187d6:
    puVar1 = mf->buffer;
    puVar2 = mf->hash;
    pos = mf->offset + uVar9;
    uVar6 = (uint)puVar1[(ulong)uVar9 + 1] ^ lzma_crc32_table[0][puVar1[uVar9]];
    uVar7 = uVar6 & 0x3ff;
    uVar5 = pos - puVar2[uVar7];
    cur = puVar1 + uVar9;
    uVar9 = (((uint)puVar1[(ulong)uVar9 + 2] << 8 ^ uVar6) & mf->hash_mask) + 0x400;
    uVar10 = puVar2[uVar9];
    puVar2[uVar7] = pos;
    puVar2[uVar9] = pos;
    uVar9 = mf->cyclic_size;
    len_best = 2;
    if ((uVar5 < uVar9) && (cur[-(ulong)uVar5] == *cur)) {
      if (len_limit < 2) {
        __assertion = "len <= limit";
        uVar9 = 0x2e;
      }
      else {
        if (-1 < (int)len_limit) {
          uVar6 = 2;
LAB_0051885f:
          len_best = len_limit;
          if (uVar6 < len_limit) {
            uVar8 = *(long *)(cur + uVar6) - *(long *)(cur + -(ulong)uVar5 + uVar6);
            if (uVar8 == 0) goto code_r0x00518871;
            uVar3 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            len_best = ((uint)(uVar3 >> 3) & 0x1fffffff) + uVar6;
            if (len_limit <= len_best) {
              len_best = len_limit;
            }
          }
          matches->len = len_best;
          matches->dist = uVar5 - 1;
          if (len_best == len_limit) {
            bt_skip_func(len_limit,pos,cur,uVar10,mf->depth,mf->son,mf->cyclic_pos,uVar9);
            move_pos(mf);
            return 1;
          }
          lVar11 = 1;
          goto LAB_0051887a;
        }
        __assertion = "limit <= UINT32_MAX / 2";
        uVar9 = 0x2f;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/memcmplen.h"
                    ,uVar9,
                    "uint32_t lzma_memcmplen(const uint8_t *, const uint8_t *, uint32_t, uint32_t)")
      ;
    }
    lVar11 = 0;
LAB_0051887a:
    plVar4 = bt_find_func(len_limit,pos,cur,uVar10,mf->depth,mf->son,mf->cyclic_pos,uVar9,
                          matches + lVar11,len_best);
    uVar10 = (uint32_t)((ulong)((long)plVar4 - (long)matches) >> 3);
    move_pos(mf);
  }
  return uVar10;
code_r0x00518871:
  uVar6 = uVar6 + 8;
  goto LAB_0051885f;
}

Assistant:

extern uint32_t
lzma_mf_bt3_find(lzma_mf *mf, lzma_match *matches)
{
	header_find(true, 3);

	hash_3_calc();

	const uint32_t delta2 = pos - mf->hash[hash_2_value];
	const uint32_t cur_match = mf->hash[FIX_3_HASH_SIZE + hash_value];

	mf->hash[hash_2_value] = pos;
	mf->hash[FIX_3_HASH_SIZE + hash_value] = pos;

	uint32_t len_best = 2;

	if (delta2 < mf->cyclic_size && *(cur - delta2) == *cur) {
		len_best = lzma_memcmplen(
				cur, cur - delta2, len_best, len_limit);

		matches[0].len = len_best;
		matches[0].dist = delta2 - 1;
		matches_count = 1;

		if (len_best == len_limit) {
			bt_skip();
			return 1; // matches_count
		}
	}

	bt_find(len_best);
}